

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  cmStateSnapshot *this_00;
  pointer pcVar1;
  string *psVar2;
  ostream *poVar3;
  char *s;
  string infoFileName;
  cmGeneratedFileStream infoFileStream;
  string local_2d8;
  cmStateDirectory local_2b8;
  cmStateDirectory local_290;
  undefined1 local_268 [584];
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_2d8);
  std::__cxx11::string::append((char *)&local_2d8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_268,&local_2d8,false,None);
  if (((byte)(*(_func_int **)(local_268._0_8_ + -0x18))[(long)(local_268 + 0x20)] & 5) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_268,true);
    WriteDisclaimer(this,(ostream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"# Relative path conversion top directories.\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"",0x24);
    this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot;
    cmStateSnapshot::GetDirectory(&local_290,this_00);
    psVar2 = cmStateDirectory::GetRelativePathTopSource_abi_cxx11_(&local_290);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_268,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"",0x24);
    cmStateSnapshot::GetDirectory(&local_2b8,this_00);
    psVar2 = cmStateDirectory::GetRelativePathTopBinary_abi_cxx11_(&local_2b8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (cmSystemTools::s_ForceUnixPaths == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"# Force unix paths in dependencies.\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"set(CMAKE_FORCE_UNIX_PATHS 1)\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"# The C and CXX include file regular expressions for ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"this directory.\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"set(CMAKE_C_INCLUDE_REGEX_SCAN ",0x1f);
    s = cmMakefile::GetIncludeRegularExpression
                  ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_268,s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ",0x23);
    WriteCMakeArgument((ostream *)local_268,
                       (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile)->
                       ComplainFileRegularExpression)._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,
               "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,
               "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n",0x48);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName = this->GetCurrentBinaryDirectory();
  infoFileName += "/CMakeFiles";
  infoFileName += "/CMakeDirectoryInformation.cmake";

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName);
  if (!infoFileStream) {
    return;
  }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  /* clang-format off */
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopSource()
    << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopBinary()
    << "\")\n"
    << "\n";
  /* clang-format on */

  // Tell the dependency scanner to use unix paths if necessary.
  if (cmSystemTools::GetForceUnixPaths()) {
    /* clang-format off */
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    /* clang-format on */
  }

  // Store the include regular expressions for this directory.
  infoFileStream << "\n"
                 << "# The C and CXX include file regular expressions for "
                 << "this directory.\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetIncludeRegularExpression());
  infoFileStream << ")\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetComplainRegularExpression());
  infoFileStream << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
                    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}